

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conc_heter_queue.h
# Opt level: O0

put_transaction<int> * __thiscall
density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
start_push<int>(put_transaction<int> *__return_storage_ptr__,
               conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
               *this,int *i_source)

{
  put_transaction<int> local_48;
  int *local_20;
  int *i_source_local;
  conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *this_local;
  
  local_20 = i_source;
  i_source_local = (int *)this;
  this_local = (conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                *)__return_storage_ptr__;
  conc_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  start_emplace<int,int>
            (&local_48,
             (conc_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>> *)
             this,i_source);
  conc_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  put_transaction<int>::put_transaction<int,void>
            ((put_transaction<int> *)__return_storage_ptr__,&local_48);
  put_transaction<int>::~put_transaction(&local_48);
  return __return_storage_ptr__;
}

Assistant:

put_transaction<typename std::decay<ELEMENT_TYPE>::type>
          start_push(ELEMENT_TYPE && i_source)
        {
            return start_emplace<typename std::decay<ELEMENT_TYPE>::type>(
              std::forward<ELEMENT_TYPE>(i_source));
        }